

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseDocument(TidyDocImpl *doc)

{
  NodeType NVar1;
  ulong uVar2;
  Node *pNVar3;
  Bool BVar4;
  int iVar5;
  Node *pNVar6;
  Node *pNVar7;
  AttVal *pAVar8;
  Node *pNVar9;
  Node **ppNVar10;
  Node **ppNVar11;
  
  pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar6 != (Node *)0x0) {
    ppNVar11 = &(doc->root).content;
    pNVar9 = (Node *)0x0;
    do {
      if (pNVar6->type == XmlDecl) {
        doc->xmlDetected = yes;
        pNVar7 = prvTidyFindXmlDecl(doc);
        if ((pNVar7 == (Node *)0x0) || ((doc->root).content == (Node *)0x0)) {
          if ((1 < pNVar6->line) || (pNVar6->column != 1)) {
            prvTidyReport(doc,&doc->root,pNVar6,0x275);
          }
          goto LAB_001450d7;
        }
LAB_001450ef:
        prvTidyReport(doc,&doc->root,pNVar6,0x235);
        prvTidyFreeNode(doc,pNVar6);
      }
      else {
LAB_001450d7:
        BVar4 = InsertMisc(&doc->root,pNVar6);
        if (BVar4 == no) {
          NVar1 = pNVar6->type;
          if (NVar1 == EndTag) goto LAB_001450ef;
          if (NVar1 == StartTag) {
            if ((((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TidyTag_HTML)) &&
                (pAVar8 = prvTidyAttrGetById(pNVar6,TidyAttr_XMLNS), pAVar8 != (AttVal *)0x0)) &&
               ((pAVar8->value != (ctmbstr)0x0 &&
                (iVar5 = prvTidytmbstrcasecmp(pAVar8->value,"http://www.w3.org/1999/xhtml"),
                iVar5 == 0)))) {
              iVar5 = *(int *)((doc->config).value + 0x21);
              doc->lexer->isvoyager = yes;
              BVar4 = (Bool)(iVar5 == 0);
              prvTidySetOptionBool(doc,TidyXhtmlOut,BVar4);
              prvTidySetOptionBool(doc,TidyXmlOut,BVar4);
              if (iVar5 == 0) {
                prvTidySetOptionBool(doc,TidyUpperCaseTags,no);
                prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
              }
            }
          }
          else if (NVar1 == DocTypeTag) {
            if (pNVar9 == (Node *)0x0) {
              pNVar6->parent = &doc->root;
              pNVar9 = (doc->root).last;
              ppNVar10 = &pNVar9->next;
              if (pNVar9 == (Node *)0x0) {
                ppNVar10 = ppNVar11;
              }
              pNVar6->prev = pNVar9;
              *ppNVar10 = pNVar6;
              (doc->root).last = pNVar6;
              pNVar9 = pNVar6;
              goto LAB_0014510f;
            }
            goto LAB_001450ef;
          }
          if (((pNVar6->type != StartTag) || (pNVar6->tag == (Dict *)0x0)) ||
             (pNVar6->tag->id != TidyTag_HTML)) {
            prvTidyUngetToken(doc);
            pNVar6 = prvTidyInferredTag(doc,TidyTag_HTML);
          }
          pNVar9 = prvTidyFindDocType(doc);
          if (pNVar9 == (Node *)0x0) {
            uVar2 = (doc->config).value[0xe].v;
            if ((uVar2 != 1) && (*(int *)((doc->config).value + 6) != 1)) {
              prvTidyReport(doc,(Node *)0x0,(Node *)0x0,600);
            }
            if ((uVar2 & 0xfffffffffffffffd) != 0) {
              prvTidyAdjustTags(doc);
            }
          }
          pNVar6->parent = &doc->root;
          pNVar9 = (doc->root).last;
          pNVar6->prev = pNVar9;
          ppNVar10 = &pNVar9->next;
          if (pNVar9 == (Node *)0x0) {
            ppNVar10 = ppNVar11;
          }
          *ppNVar10 = pNVar6;
          (doc->root).last = pNVar6;
          prvTidyParseHTML(doc,pNVar6,IgnoreWhitespace);
          break;
        }
      }
LAB_0014510f:
      pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (pNVar6 != (Node *)0x0);
  }
  if ((doc->config).value[1].v != 0) {
    prvTidyAccessibilityChecks(doc);
  }
  pNVar6 = prvTidyFindHTML(doc);
  if (pNVar6 == (Node *)0x0) {
    pNVar9 = prvTidyInferredTag(doc,TidyTag_HTML);
    pNVar9->parent = &doc->root;
    pNVar6 = (doc->root).last;
    pNVar9->prev = pNVar6;
    ppNVar11 = &pNVar6->next;
    if (pNVar6 == (Node *)0x0) {
      ppNVar11 = &(doc->root).content;
    }
    *ppNVar11 = pNVar9;
    (doc->root).last = pNVar9;
    prvTidyParseHTML(doc,pNVar9,IgnoreWhitespace);
  }
  pNVar6 = prvTidyFindTITLE(doc);
  if (pNVar6 == (Node *)0x0) {
    pNVar6 = prvTidyFindHEAD(doc);
    if (*(int *)((doc->config).value + 6) != 1) {
      prvTidyReport(doc,pNVar6,(Node *)0x0,0x262);
    }
    pNVar7 = prvTidyInferredTag(doc,TidyTag_TITLE);
    pNVar7->parent = pNVar6;
    pNVar9 = pNVar6->last;
    pNVar7->prev = pNVar9;
    ppNVar11 = &pNVar6->content;
    if (pNVar9 != (Node *)0x0) {
      ppNVar11 = &pNVar9->next;
    }
    *ppNVar11 = pNVar7;
    pNVar6->last = pNVar7;
  }
  AttributeChecks(doc,&doc->root);
  ReplaceObsoleteElements(doc,&doc->root);
  prvTidyDropEmptyElements(doc,&doc->root);
  CleanSpaces(doc,&doc->root);
  if ((*(int *)((doc->config).value + 0x17) != 0) &&
     (pNVar6 = prvTidyFindBody(doc), pNVar6 != (Node *)0x0)) {
    pNVar6 = pNVar6->content;
    while (pNVar6 != (Node *)0x0) {
      BVar4 = prvTidynodeIsText(pNVar6);
      if (((BVar4 == no) || (BVar4 = prvTidyIsBlank(doc->lexer,pNVar6), BVar4 != no)) &&
         ((BVar4 = prvTidynodeIsElement(pNVar6), BVar4 == no ||
          (BVar4 = nodeCMIsOnlyInline(pNVar6), BVar4 == no)))) {
        pNVar6 = pNVar6->next;
      }
      else {
        pNVar7 = prvTidyInferredTag(doc,TidyTag_P);
        pNVar9 = pNVar6->parent;
        pNVar7->parent = pNVar9;
        pNVar7->next = pNVar6;
        pNVar7->prev = pNVar6->prev;
        pNVar6->prev = pNVar7;
        if (pNVar7->prev != (Node *)0x0) {
          pNVar7->prev->next = pNVar7;
        }
        if (pNVar9->content == pNVar6) {
          pNVar9->content = pNVar7;
        }
        pNVar9 = pNVar6;
        do {
          BVar4 = prvTidynodeIsElement(pNVar9);
          if ((BVar4 != no) && (BVar4 = nodeCMIsOnlyInline(pNVar9), pNVar6 = pNVar9, BVar4 == no))
          break;
          pNVar6 = pNVar9->next;
          prvTidyRemoveNode(pNVar9);
          pNVar9->parent = pNVar7;
          pNVar3 = pNVar7->last;
          pNVar9->prev = pNVar3;
          ppNVar11 = &pNVar3->next;
          if (pNVar3 == (Node *)0x0) {
            ppNVar11 = &pNVar7->content;
          }
          *ppNVar11 = pNVar9;
          pNVar7->last = pNVar9;
          pNVar9 = pNVar6;
        } while (pNVar6 != (Node *)0x0);
        TrimSpaces(doc,pNVar7);
      }
    }
  }
  if (*(int *)((doc->config).value + 0x16) == 0) {
    return;
  }
  EncloseBlockText(doc,&doc->root);
  return;
}

Assistant:

void TY_(ParseDocument)(TidyDocImpl* doc)
{
    Node *node, *html, *doctype = NULL;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->type == XmlDecl)
        {
            doc->xmlDetected = yes;

            if (TY_(FindXmlDecl)(doc) && doc->root.content)
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
            if (node->line > 1 || node->column != 1)
            {
                TY_(Report)(doc, &doc->root, node, SPACE_PRECEDING_XMLDECL);
            }
        }

        /* deal with comments etc. */
        if (InsertMisc( &doc->root, node ))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if (node->type == StartTag && nodeIsHTML(node))
        {
            AttVal *xmlns;

            xmlns = TY_(AttrGetById)(node, TidyAttr_XMLNS);

            if (AttrValueIs(xmlns, XHTML_NAMESPACE))
            {
                Bool htmlOut = cfgBool( doc, TidyHtmlOut );
                doc->lexer->isvoyager = yes;                  /* Unless plain HTML */
                TY_(SetOptionBool)( doc, TidyXhtmlOut, !htmlOut ); /* is specified, output*/
                TY_(SetOptionBool)( doc, TidyXmlOut, !htmlOut );   /* will be XHTML. */

                /* adjust other config options, just as in config.c */
                if ( !htmlOut )
                {
                    TY_(SetOptionBool)( doc, TidyUpperCaseTags, no );
                    TY_(SetOptionInt)( doc, TidyUpperCaseAttrs, no );
                }
            }
        }

        if ( node->type != StartTag || !nodeIsHTML(node) )
        {
            TY_(UngetToken)( doc );
            html = TY_(InferredTag)(doc, TidyTag_HTML);
        }
        else
            html = node;

        /*\
         *  #72, avoid MISSING_DOCTYPE if show-body-only. 
         *  #191, also if --doctype omit, that is TidyDoctypeOmit
         *  #342, adjust tags to html4-- if not 'auto' or 'html5'
        \*/
        if (!TY_(FindDocType)(doc)) 
        {
            ulong dtmode = cfg( doc, TidyDoctypeMode );
            if ((dtmode != TidyDoctypeOmit) && !showingBodyOnly(doc))
                TY_(Report)(doc, NULL, NULL, MISSING_DOCTYPE);
            if ((dtmode != TidyDoctypeAuto) && (dtmode != TidyDoctypeHtml5))
            {
                /*\
                 *  Issue #342 - if not doctype 'auto', or 'html5'
                 *  then reset mode htm4-- parsing
                \*/
                TY_(AdjustTags)(doc); /* Dynamically modify the tags table to html4-- mode */
            }
        }
        TY_(InsertNodeAtEnd)( &doc->root, html);
        TY_(ParseHTML)( doc, html, IgnoreWhitespace );
        break;
    }

    /* do this before any more document fixes */
    if ( cfg( doc, TidyAccessibilityCheckLevel ) > 0 )
        TY_(AccessibilityChecks)( doc );

    if (!TY_(FindHTML)(doc))
    {
        /* a later check should complain if <body> is empty */
        html = TY_(InferredTag)(doc, TidyTag_HTML);
        TY_(InsertNodeAtEnd)( &doc->root, html);
        TY_(ParseHTML)(doc, html, IgnoreWhitespace);
    }

    if (!TY_(FindTITLE)(doc))
    {
        Node* head = TY_(FindHEAD)(doc);
        /* #72, avoid MISSING_TITLE_ELEMENT if show-body-only (but allow InsertNodeAtEnd to avoid new warning) */
        if (!showingBodyOnly(doc))
        {
            TY_(Report)(doc, head, NULL, MISSING_TITLE_ELEMENT);
        }
        TY_(InsertNodeAtEnd)(head, TY_(InferredTag)(doc, TidyTag_TITLE));
    }

    AttributeChecks(doc, &doc->root);
    ReplaceObsoleteElements(doc, &doc->root);
    TY_(DropEmptyElements)(doc, &doc->root);
    CleanSpaces(doc, &doc->root);

    if (cfgBool(doc, TidyEncloseBodyText))
        EncloseBodyText(doc);
    if (cfgBool(doc, TidyEncloseBlockText))
        EncloseBlockText(doc, &doc->root);
}